

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureCube_GL.cpp
# Opt level: O2

void __thiscall
Diligent::TextureCube_GL::UpdateData
          (TextureCube_GL *this,GLContextState *ContextState,Uint32 MipLevel,Uint32 Slice,
          Box *DstBox,TextureSubResData *SubresData)

{
  Uint32 UVar1;
  Uint32 UVar2;
  GLenum GVar3;
  IBuffer *pSrcPtr;
  PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC p_Var4;
  uint uVar5;
  int iVar6;
  TextureFormatAttribs *pTVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  BufferGLImpl *pBufferGL;
  uint uVar11;
  ulong uVar12;
  GLuint GVar13;
  TextureSubResData *pTVar14;
  NativePixelAttribs NVar15;
  char (*in_stack_ffffffffffffff78) [2];
  Uint32 BlockBytesInRow;
  GLenum local_74;
  string msg;
  
  TextureBaseGL::UpdateData
            (&this->super_TextureBaseGL,ContextState,MipLevel,Slice,DstBox,SubresData);
  GLContextState::BindTexture
            (ContextState,-1,(this->super_TextureBaseGL).m_BindTarget,
             &(this->super_TextureBaseGL).m_GlTexture);
  GVar13 = 0;
  local_74 = 0;
  if (Slice < 6) {
    local_74 = *(GLenum *)
                (GetCubeMapFaceBindTarget(unsigned_int)::CubeMapFaceTargets + (ulong)Slice * 4);
  }
  pSrcPtr = SubresData->pSrcBuffer;
  if (pSrcPtr != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferGLImpl,Diligent::IBuffer>(pSrcPtr);
    GVar13 = *(GLuint *)((long)&pSrcPtr[0x11].super_IDeviceObject.super_IObject._vptr_IObject + 4);
  }
  (*__glewBindBuffer)(0x88ec,GVar13);
  NVar15 = GetNativePixelTransferAttribs
                     ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                      .m_Desc.Format);
  glPixelStorei(0xcf5,4);
  glPixelStorei(0xcf4,0);
  glPixelStorei(0xcf3,0);
  if (((undefined1  [12])NVar15 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
    pTVar7 = GetTextureFormatAttribs
                       ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    uVar12 = (ulong)pTVar7->ComponentSize * (ulong)pTVar7->NumComponents;
    uVar9 = SubresData->Stride;
    if (uVar9 % uVar12 != 0) {
      FormatString<char[42]>(&msg,(char (*) [42])"Data stride is not multiple of pixel size");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                 ,0xe6);
      std::__cxx11::string::~string((string *)&msg);
      uVar9 = SubresData->Stride;
    }
    msg._M_dataplus._M_p = (pointer)(uVar9 / uVar12);
    iVar6 = StaticCast<int,unsigned_long>((unsigned_long *)&msg);
    glPixelStorei(0xcf2,iVar6);
    glTexSubImage2D();
  }
  else {
    uVar11 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             .m_Desc.Width >> ((byte)MipLevel & 0x1f);
    uVar11 = uVar11 + (uVar11 == 0);
    uVar10 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             .m_Desc.Height >> ((byte)MipLevel & 0x1f);
    uVar10 = uVar10 + (uVar10 == 0);
    if (((((DstBox->MinX & 3) != 0) || ((DstBox->MinY & 3) != 0)) ||
        (DstBox->MaxX != uVar11 && (DstBox->MaxX & 3) != 0)) ||
       (DstBox->MaxY != uVar10 && (DstBox->MaxY & 3) != 0)) {
      FormatString<char[57]>
                (&msg,(char (*) [57])"Compressed texture update region must be 4 pixel-aligned");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                 ,0xbb);
      std::__cxx11::string::~string((string *)&msg);
    }
    pTVar7 = GetTextureFormatAttribs
                       ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                        .m_Desc.Format);
    BlockBytesInRow = (uint)pTVar7->ComponentSize * ((DstBox->MaxX - DstBox->MinX) + 3 >> 2);
    if (SubresData->Stride != (ulong)BlockBytesInRow) {
      FormatString<char[25],unsigned_long,char[53],unsigned_int,char[2]>
                (&msg,(Diligent *)"Compressed data stride (",(char (*) [25])&SubresData->Stride,
                 (unsigned_long *)" must match the size of a row of compressed blocks (",
                 (char (*) [53])&BlockBytesInRow,(uint *)0x2caa26,in_stack_ffffffffffffff78);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"UpdateData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
                 ,0xc2);
      std::__cxx11::string::~string((string *)&msg);
    }
    glPixelStorei(0xcf2,0);
    p_Var4 = __glewCompressedTexSubImage2D;
    UVar1 = DstBox->MinX;
    uVar5 = DstBox->MaxX - UVar1;
    UVar2 = DstBox->MinY;
    uVar8 = DstBox->MaxY - UVar2;
    uVar11 = uVar11 - UVar1;
    if (uVar5 <= uVar11) {
      uVar11 = uVar5;
    }
    uVar10 = uVar10 - UVar2;
    if (uVar8 <= uVar10) {
      uVar10 = uVar8;
    }
    GVar3 = (this->super_TextureBaseGL).m_GLTexFormat;
    msg._M_dataplus._M_p = (pointer)((ulong)(uVar8 + 3 >> 2) * SubresData->Stride);
    iVar6 = StaticCast<int,unsigned_long>((unsigned_long *)&msg);
    pTVar14 = (TextureSubResData *)&SubresData->SrcOffset;
    if (SubresData->pSrcBuffer == (IBuffer *)0x0) {
      pTVar14 = SubresData;
    }
    (*p_Var4)(local_74,MipLevel,UVar1,UVar2,uVar11,uVar10,GVar3,iVar6,pTVar14->pData);
  }
  BlockBytesInRow = glGetError();
  if (BlockBytesInRow != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0xf6,(char (*) [31])"Failed to update subimage data",
               (char (*) [17])"\nGL Error Code: ",&BlockBytesInRow);
    FormatString<char[6]>(&msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureCube_GL.cpp"
               ,0xf6);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (GVar13 != 0) {
    (*__glewBindBuffer)(0x88ec,0);
  }
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length._0_4_ = 0;
  GLContextState::BindTexture
            (ContextState,-1,(this->super_TextureBaseGL).m_BindTarget,(GLTextureObj *)&msg);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&msg);
  return;
}

Assistant:

void TextureCube_GL::UpdateData(GLContextState&          ContextState,
                                Uint32                   MipLevel,
                                Uint32                   Slice,
                                const Box&               DstBox,
                                const TextureSubResData& SubresData)
{
    TextureBaseGL::UpdateData(ContextState, MipLevel, Slice, DstBox, SubresData);

    // Texture must be bound as GL_TEXTURE_CUBE_MAP, but glTexSubImage2D()
    // then takes one of GL_TEXTURE_CUBE_MAP_POSITIVE_X ... GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
    ContextState.BindTexture(-1, m_BindTarget, m_GlTexture);

    auto CubeMapFaceBindTarget = GetCubeMapFaceBindTarget(Slice);

    // Bind buffer if it is provided; copy from CPU memory otherwise
    GLuint UnpackBuffer = 0;
    if (SubresData.pSrcBuffer != nullptr)
    {
        auto* pBufferGL = ClassPtrCast<BufferGLImpl>(SubresData.pSrcBuffer);
        UnpackBuffer    = pBufferGL->GetGLHandle();
    }

    // Transfers to OpenGL memory are called unpack operations
    // If there is a buffer bound to GL_PIXEL_UNPACK_BUFFER target, then all the pixel transfer
    // operations will be performed from this buffer.
    glBindBuffer(GL_PIXEL_UNPACK_BUFFER, UnpackBuffer);

    const auto& TransferAttribs = GetNativePixelTransferAttribs(m_Desc.Format);

    glPixelStorei(GL_UNPACK_ALIGNMENT, PBOOffsetAlignment);
    glPixelStorei(GL_UNPACK_SKIP_PIXELS, 0);
    glPixelStorei(GL_UNPACK_SKIP_ROWS, 0);

    if (TransferAttribs.IsCompressed)
    {
        auto MipWidth  = std::max(m_Desc.Width >> MipLevel, 1U);
        auto MipHeight = std::max(m_Desc.Height >> MipLevel, 1U);
        // clang-format off
        VERIFY((DstBox.MinX % 4) == 0 && (DstBox.MinY % 4) == 0 &&
               ((DstBox.MaxX % 4) == 0 || DstBox.MaxX == MipWidth) &&
               ((DstBox.MaxY % 4) == 0 || DstBox.MaxY == MipHeight),
               "Compressed texture update region must be 4 pixel-aligned" );
        // clang-format on
#ifdef DILIGENT_DEBUG
        {
            const auto& FmtAttribs      = GetTextureFormatAttribs(m_Desc.Format);
            auto        BlockBytesInRow = ((DstBox.Width() + 3) / 4) * Uint32{FmtAttribs.ComponentSize};
            VERIFY(SubresData.Stride == BlockBytesInRow,
                   "Compressed data stride (", SubresData.Stride, " must match the size of a row of compressed blocks (", BlockBytesInRow, ")");
        }
#endif

        glPixelStorei(GL_UNPACK_ROW_LENGTH, 0); // Must be 0 on WebGL
        //glPixelStorei(GL_UNPACK_COMPRESSED_BLOCK_WIDTH, 0);

        // Texture must be bound as GL_TEXTURE_CUBE_MAP, but glCompressedTexSubImage2D()
        // takes one of GL_TEXTURE_CUBE_MAP_POSITIVE_X ... GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
        auto UpdateRegionWidth  = DstBox.Width();
        auto UpdateRegionHeight = DstBox.Height();
        UpdateRegionWidth       = std::min(UpdateRegionWidth, MipWidth - DstBox.MinX);
        UpdateRegionHeight      = std::min(UpdateRegionHeight, MipHeight - DstBox.MinY);
        glCompressedTexSubImage2D(CubeMapFaceBindTarget, MipLevel,
                                  DstBox.MinX,
                                  DstBox.MinY,
                                  UpdateRegionWidth,
                                  UpdateRegionHeight,
                                  // The format must be the same compressed-texture format previously
                                  // specified by glTexStorage2D() (thank you OpenGL for another useless
                                  // parameter that is nothing but the source of confusion), otherwise
                                  // INVALID_OPERATION error is generated.
                                  m_GLTexFormat,
                                  // An INVALID_VALUE error is generated if imageSize is not consistent with
                                  // the format, dimensions, and contents of the compressed image( too little or
                                  // too much data ),
                                  StaticCast<GLsizei>(((DstBox.Height() + 3) / 4) * SubresData.Stride),
                                  // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                                  // as a byte offset into the buffer object's data store.
                                  // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glCompressedTexSubImage2D.xhtml
                                  SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    else
    {
        const auto& TexFmtInfo = GetTextureFormatAttribs(m_Desc.Format);
        const auto  PixelSize  = Uint32{TexFmtInfo.NumComponents} * Uint32{TexFmtInfo.ComponentSize};
        VERIFY((SubresData.Stride % PixelSize) == 0, "Data stride is not multiple of pixel size");
        glPixelStorei(GL_UNPACK_ROW_LENGTH, StaticCast<GLint>(SubresData.Stride / PixelSize));

        // Texture must be bound as GL_TEXTURE_CUBE_MAP, but glTexSubImage2D()
        // takes one of GL_TEXTURE_CUBE_MAP_POSITIVE_X ... GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
        glTexSubImage2D(CubeMapFaceBindTarget, MipLevel,
                        DstBox.MinX,
                        DstBox.MinY,
                        DstBox.Width(),
                        DstBox.Height(),
                        TransferAttribs.PixelFormat, TransferAttribs.DataType,
                        // If a non-zero named buffer object is bound to the GL_PIXEL_UNPACK_BUFFER target, 'data' is treated
                        // as a byte offset into the buffer object's data store.
                        // https://www.khronos.org/registry/OpenGL-Refpages/gl4/html/glTexSubImage2D.xhtml
                        SubresData.pSrcBuffer != nullptr ? reinterpret_cast<void*>(StaticCast<size_t>(SubresData.SrcOffset)) : SubresData.pData);
    }
    DEV_CHECK_GL_ERROR("Failed to update subimage data");

    if (UnpackBuffer != 0)
        glBindBuffer(GL_PIXEL_UNPACK_BUFFER, 0);

    ContextState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}